

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void notch::core::internal::conv2d<3ul,float*,float*>
               (float *image,size_t imageWidth,size_t imageHeight,float *kernel,float *result)

{
  size_t sVar1;
  float *pfVar2;
  float *imagePos;
  long lVar3;
  float fVar4;
  
  pfVar2 = image + imageWidth + 1;
  for (lVar3 = 0; lVar3 != imageHeight - 2; lVar3 = lVar3 + 1) {
    imagePos = pfVar2;
    for (sVar1 = 2; imageWidth != sVar1; sVar1 = sVar1 + 1) {
      fVar4 = conv2dAt<3ul,float*>(imagePos,imageWidth,kernel);
      result[sVar1 - 2] = fVar4;
      imagePos = imagePos + 1;
    }
    pfVar2 = pfVar2 + imageWidth;
    result = result + (imageWidth - 2);
  }
  return;
}

Assistant:

void
conv2d(Iter image, const size_t imageWidth, const size_t imageHeight,
       Iter kernel, OutIter result) {
    size_t pad = kernelSize/2;
    Iter image_topleft = image + pad*imageWidth + pad;
    size_t resultWidth = imageWidth - kernelSize + 1;
    size_t resultHeight = imageHeight - kernelSize + 1;
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(image_topleft, kernel, resultWidth, resultHeight)
#endif
    for (OMP_size_t r = 0; r < resultHeight; ++r) {
        for (size_t c = 0; c < resultWidth; ++c) {
            Iter image_rc = image_topleft + r*imageWidth + c;
            OutIter result_rc = result + r*resultWidth + c;
            *result_rc = conv2dAt<kernelSize, Iter>(image_rc, imageWidth, kernel);
        }
    }
}